

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstHelper.hpp
# Opt level: O1

Literal * Kernel::SubstHelper::
          apply<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::GenMatcher::Applicator>
                    (Literal *lit,Applicator *applicator)

{
  TermList trm;
  Term *pTVar1;
  TermList sort;
  Literal *pLVar2;
  ulong uVar3;
  
  pTVar1 = applyImpl<false,Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::GenMatcher::Applicator>
                     (&lit->super_Term,applicator,false);
  if (*(int *)&pTVar1->field_0xc < 0) {
    trm._content = (lit->super_Term).field_9._sort._content;
    sort = applyImpl<false,Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::GenMatcher::Applicator>
                     (trm,applicator,false);
    if (trm._content != sort._content) {
      uVar3 = (ulong)(*(uint *)&pTVar1->field_0xc & 0xfffffff);
      pLVar2 = Literal::createEquality
                         (SUB41(((uint)pTVar1->_args[0]._content & 4) >> 2,0),
                          (TermList)pTVar1->_args[uVar3]._content,
                          (TermList)pTVar1->_args[uVar3 - 1]._content,sort);
      return pLVar2;
    }
  }
  return (Literal *)pTVar1;
}

Assistant:

static Literal* apply(Literal* lit, Applicator& applicator)
  {
    Literal* subbedLit = static_cast<Literal*>(apply(static_cast<Term*>(lit),applicator));
    if(subbedLit->isTwoVarEquality()){ //either nothing's changed or variant
      TermList sort = lit->twoVarEqSort();
      TermList newSort = apply(sort, applicator);
      if((sort != newSort)){
        subbedLit = Literal::createEquality(subbedLit->polarity(), *subbedLit->nthArgument(0), *subbedLit->nthArgument(1), newSort);
      }
    }
    return subbedLit;
  }